

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test7::GPUShaderFP64Test7(GPUShaderFP64Test7 *this,Context *context)

{
  Context *context_local;
  GPUShaderFP64Test7 *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"varyings",
             "Verifies double-precision floating-point varyings work correctly in all shader stages."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GPUShaderFP64Test7_0322e058;
  this->m_are_double_inputs_supported = false;
  std::__cxx11::string::string((string *)&this->m_current_fs_body);
  std::__cxx11::string::string((string *)&this->m_current_gs_body);
  std::__cxx11::string::string((string *)&this->m_current_tc_body);
  std::__cxx11::string::string((string *)&this->m_current_te_body);
  std::__cxx11::string::string((string *)&this->m_current_vs_body);
  this->m_fbo_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_has_test_passed = true;
  this->m_n_max_components_per_stage = 0;
  this->m_n_xfb_varyings = 0;
  this->m_po_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_to_id = 0;
  this->m_to_data = (uchar *)0x0;
  this->m_to_height = 4;
  this->m_to_width = 4;
  this->m_xfb_bo_id = 0;
  this->m_xfb_varyings = (GLchar **)0x0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

GPUShaderFP64Test7::GPUShaderFP64Test7(deqp::Context& context)
	: TestCase(context, "varyings", "Verifies double-precision floating-point varyings work correctly "
									"in all shader stages.")
	, m_are_double_inputs_supported(false)
	, m_fbo_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_has_test_passed(true)
	, m_n_max_components_per_stage(0)
	, m_n_xfb_varyings(0)
	, m_po_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_to_id(0)
	, m_to_data(NULL)
	, m_to_height(4)
	, m_to_width(4)
	, m_xfb_bo_id(0)
	, m_xfb_varyings(NULL)
	, m_vao_id(0)
	, m_vs_id(0)
{
}